

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

xmlChar * xmlCatalogLocalResolve(void *catalogs,xmlChar *pubID,xmlChar *sysID)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlChar *pxVar4;
  char *pcVar5;
  
  if (xmlCatalogInitialized == '\0') {
    xmlInitializeCatalog();
  }
  if (pubID != (xmlChar *)0x0 || sysID != (xmlChar *)0x0) {
    if (xmlDebugCatalogs != 0) {
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      if (sysID == (xmlChar *)0x0 || pubID == (xmlChar *)0x0) {
        if (pubID == (xmlChar *)0x0) {
          pcVar5 = "Local Resolve: sysID %s\n";
          pxVar4 = sysID;
        }
        else {
          pcVar5 = "Local Resolve: pubID %s\n";
          pxVar4 = pubID;
        }
        (*p_Var1)(*ppvVar3,pcVar5,pxVar4);
      }
      else {
        (*p_Var1)(*ppvVar3,"Local Resolve: pubID %s sysID %s\n",pubID,sysID);
      }
    }
    if ((catalogs != (void *)0x0) &&
       (pxVar4 = xmlCatalogListXMLResolve((xmlCatalogEntryPtr)catalogs,pubID,sysID),
       &DAT_00000001 < pxVar4 + 1)) {
      return pxVar4;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlCatalogLocalResolve(void *catalogs, const xmlChar *pubID,
	               const xmlChar *sysID) {
    xmlCatalogEntryPtr catal;
    xmlChar *ret;

    if (!xmlCatalogInitialized)
	xmlInitializeCatalog();

    if ((pubID == NULL) && (sysID == NULL))
	return(NULL);

    if (xmlDebugCatalogs) {
        if ((pubID != NULL) && (sysID != NULL)) {
            xmlGenericError(xmlGenericErrorContext,
                            "Local Resolve: pubID %s sysID %s\n", pubID, sysID);
        } else if (pubID != NULL) {
            xmlGenericError(xmlGenericErrorContext,
                            "Local Resolve: pubID %s\n", pubID);
        } else {
            xmlGenericError(xmlGenericErrorContext,
                            "Local Resolve: sysID %s\n", sysID);
        }
    }

    catal = (xmlCatalogEntryPtr) catalogs;
    if (catal == NULL)
	return(NULL);
    ret = xmlCatalogListXMLResolve(catal, pubID, sysID);
    if ((ret != NULL) && (ret != XML_CATAL_BREAK))
	return(ret);
    return(NULL);
}